

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O0

int __thiscall
Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::joinRegions
          (Preprocess *this,int v,int w)

{
  Preprocess *this_00;
  VariableRegion *pVVar1;
  int in_EDX;
  int in_ESI;
  int r;
  VariableRegion *in_stack_ffffffffffffff68;
  int v_00;
  Preprocess *in_stack_ffffffffffffff70;
  IntUnionFind *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff8c;
  IntUnionFind *in_stack_ffffffffffffff90;
  VariableRegion *in_stack_ffffffffffffffc0;
  VariableRegion *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  local_4 = in_ESI;
  if (in_ESI != in_EDX) {
    Lib::IntUnionFind::doUnion
              (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (int)in_stack_ffffffffffffff70);
    local_4 = Lib::IntUnionFind::root(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    this_00 = (Preprocess *)
              varSet(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    varSet(this_00,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    VariableRegion::VariableRegion((VariableRegion *)this_00,in_stack_ffffffffffffff68);
    v_00 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    VariableRegion::meet(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    pVVar1 = varSet(this_00,v_00);
    VariableRegion::operator=((VariableRegion *)this_00,pVVar1);
    VariableRegion::~VariableRegion((VariableRegion *)0x7402ad);
    VariableRegion::~VariableRegion((VariableRegion *)0x7402b7);
  }
  return local_4;
}

Assistant:

int joinRegions(int v, int w)
  {
    if (v == w) return v;

    components.doUnion(v,w);
    auto r = components.root(v);
    varSet(r) = std::move(varSet(v)).meet(std::move(varSet(w)));

    return r;
  }